

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O3

size_t __thiscall Lodtalk::MethodAssembler::Assembler::computeInstructionsSize(Assembler *this)

{
  InstructionNode *pIVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t sVar3;
  InstructionNode **instr_2;
  InstructionNode **instr;
  pointer ppIVar4;
  InstructionNode **instr_1;
  pointer ppIVar5;
  pointer ppIVar6;
  size_t sVar7;
  bool bVar8;
  
  ppIVar4 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppIVar6 = (this->instructionStream).
            super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  sVar7 = 0;
  ppIVar5 = ppIVar4;
  if (ppIVar4 != ppIVar6) {
    do {
      pIVar1 = *ppIVar4;
      pIVar1->position = sVar7;
      iVar2 = (*pIVar1->_vptr_InstructionNode[4])(pIVar1);
      pIVar1->size = CONCAT44(extraout_var,iVar2);
      sVar7 = CONCAT44(extraout_var,iVar2) + sVar7;
      pIVar1 = *ppIVar4;
      pIVar1->lastPosition = pIVar1->position;
      pIVar1->lastSize = pIVar1->size;
      ppIVar4 = ppIVar4 + 1;
    } while (ppIVar4 != ppIVar6);
    ppIVar4 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    ppIVar5 = (this->instructionStream).
              super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
  }
  do {
    sVar3 = 0;
    ppIVar6 = ppIVar5;
    if (ppIVar5 != ppIVar4) {
      do {
        pIVar1 = *ppIVar5;
        pIVar1->position = sVar3;
        iVar2 = (*pIVar1->_vptr_InstructionNode[5])(pIVar1);
        pIVar1->size = CONCAT44(extraout_var_00,iVar2);
        sVar3 = CONCAT44(extraout_var_00,iVar2) + sVar3;
        ppIVar5 = ppIVar5 + 1;
      } while (ppIVar5 != ppIVar4);
      ppIVar5 = (this->instructionStream).
                super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppIVar4 = (this->instructionStream).
                super__Vector_base<Lodtalk::MethodAssembler::InstructionNode_*,_std::allocator<Lodtalk::MethodAssembler::InstructionNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      ppIVar6 = ppIVar5;
    }
    for (; ppIVar5 != ppIVar4; ppIVar5 = ppIVar5 + 1) {
      pIVar1 = *ppIVar5;
      pIVar1->lastPosition = pIVar1->position;
      pIVar1->lastSize = pIVar1->size;
    }
    bVar8 = sVar3 < sVar7;
    ppIVar5 = ppIVar6;
    sVar7 = sVar3;
  } while (bVar8);
  return sVar3;
}

Assistant:

size_t Assembler::computeInstructionsSize()
{
	// Compute the max size.
	size_t maxSize = 0;
	for(auto &instr : instructionStream)
    {
		maxSize += instr->computeMaxSizeForPosition(maxSize);
        instr->commitSize();
    }

	// Compute the optimal iteratively.
	size_t oldSize = maxSize;
	size_t currentSize = maxSize;
	do
	{
		oldSize = currentSize;
		currentSize = 0;
		for(auto &instr : instructionStream)
			currentSize += instr->computeBetterSizeForPosition(currentSize);
        for(auto &instr : instructionStream)
            instr->commitSize();
	} while(currentSize < oldSize);

	return currentSize;
}